

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,StringData *value)

{
  bool bVar1;
  StringData sdata;
  StringData local_40;
  
  if (value != (StringData *)0x0) {
    local_40.value._M_dataplus._M_p = (pointer)&local_40.value.field_2;
    local_40.value._M_string_length = 0;
    local_40.value.field_2._M_local_buf[0] = '\0';
    local_40.is_triple_quoted = false;
    local_40.single_quote = false;
    local_40.line_row = 0;
    local_40.line_col = 0;
    bVar1 = MaybeTripleQuotedString(this,&local_40);
    if ((bVar1) || (bVar1 = MaybeString(this,&local_40), bVar1)) {
      tinyusdz::value::StringData::operator=(value,&local_40);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    ::std::__cxx11::string::_M_dispose();
    return bVar1;
  }
  return false;
}

Assistant:

bool AsciiParser::ReadBasicType(value::StringData *value) {
  if (!value) {
    return false;
  }

  // May be triple-quoted string
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      (*value) = sdata;
      return true;

    } else if (MaybeString(&sdata)) {
      (*value) = sdata;
      return true;
    }
  }

  return false;
}